

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_set_standard_lookup.c
# Opt level: O1

void cleanup(EVP_PKEY_CTX *ctx)

{
  archive_string *as;
  undefined8 *puVar1;
  undefined8 *__ptr;
  
  as = (archive_string *)**(undefined8 **)(ctx + 0x9a8);
  __ptr = (undefined8 *)as[2].buffer_length;
  while (__ptr != (undefined8 *)0x0) {
    puVar1 = (undefined8 *)*__ptr;
    free((void *)__ptr[2]);
    free_options((mtree_option *)__ptr[1]);
    free(__ptr);
    __ptr = puVar1;
  }
  archive_string_free(as);
  archive_string_free((archive_string *)&as[3].length);
  archive_string_free((archive_string *)&as[4].length);
  archive_entry_linkresolver_free((archive_entry_linkresolver *)as[5].length);
  free((void *)as[1].length);
  free(as);
  **(undefined8 **)(ctx + 0x9a8) = 0;
  return;
}

Assistant:

static void
cleanup(void *data)
{
	struct name_cache *cache = (struct name_cache *)data;
	size_t i;

	if (cache != NULL) {
		for (i = 0; i < cache->size; i++) {
			if (cache->cache[i].name != NULL &&
			    cache->cache[i].name != NO_NAME)
				free((void *)(uintptr_t)cache->cache[i].name);
		}
		free(cache->buff);
		free(cache);
	}
}